

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsDictionaryMatcher::matches
          (UCharsDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,
          int32_t *lengths,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  UChar UVar1;
  bool bVar2;
  int32_t uchar;
  UStringTrieResult UVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  UCharsTrie local_68;
  int32_t *local_48;
  int32_t *local_40;
  UChar *local_38;
  
  local_68.uchars_ = this->characters;
  local_68.ownedArray_ = (char16_t *)0x0;
  local_68.remainingMatchLength_ = -1;
  local_68.pos_ = local_68.uchars_;
  local_38 = local_68.uchars_;
  iVar5 = utext_getNativeIndex_63(text);
  local_48 = lengths;
  local_40 = cpLengths;
  uchar = utext_next32_63(text);
  iVar8 = 0;
  iVar9 = 0;
  while (iVar4 = iVar9, -1 < uchar) {
    if (iVar9 == 0) {
      local_68.remainingMatchLength_ = -1;
      UVar3 = UCharsTrie::nextImpl(&local_68,local_68.uchars_,uchar);
    }
    else {
      UVar3 = UCharsTrie::next(&local_68,uchar);
    }
    iVar6 = utext_getNativeIndex_63(text);
    iVar4 = (int)iVar6 - (int)iVar5;
    if ((int)UVar3 < 2) {
      if (UVar3 == USTRINGTRIE_NO_MATCH) goto LAB_002e51eb;
LAB_002e5159:
      bVar2 = iVar4 < maxLength;
    }
    else {
      if (iVar8 < limit) {
        if (values != (int32_t *)0x0) {
          UVar1 = *local_68.pos_;
          if (UVar1 < L'\0') {
            uVar7 = (ushort)UVar1 & 0x7fff;
            if (0x3fff < uVar7) {
              if (uVar7 == 0x7fff) goto LAB_002e51aa;
              uVar7 = uVar7 * 0x10000 + (uint)(ushort)local_68.pos_[1] + 0xc0000000;
            }
          }
          else if ((ushort)UVar1 < 0x4040) {
            uVar7 = ((ushort)UVar1 >> 6) - 1;
          }
          else if ((ushort)UVar1 < 0x7fc0) {
            uVar7 = ((ushort)UVar1 & 0x7fc0) * 0x400 + (uint)(ushort)local_68.pos_[1] + 0xfeff0000;
          }
          else {
LAB_002e51aa:
            uVar7 = CONCAT22(local_68.pos_[1],local_68.pos_[2]);
          }
          values[iVar8] = uVar7;
        }
        if (local_48 != (int32_t *)0x0) {
          local_48[iVar8] = iVar4;
        }
        if (local_40 != (int32_t *)0x0) {
          local_40[iVar8] = iVar9 + 1;
        }
        iVar8 = iVar8 + 1;
      }
      if (UVar3 != USTRINGTRIE_FINAL_VALUE) goto LAB_002e5159;
LAB_002e51eb:
      bVar2 = false;
    }
    iVar4 = iVar9 + 1;
    if (!bVar2) break;
    iVar9 = iVar9 + 1;
    uchar = utext_next32_63(text);
  }
  if (prefix != (int32_t *)0x0) {
    *prefix = iVar4;
  }
  UCharsTrie::~UCharsTrie(&local_68);
  return iVar8;
}

Assistant:

int32_t UCharsDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {

    UCharsTrie uct(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? uct.first(c) : uct.next(c);
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = uct.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}